

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O2

double __thiscall osc::ReceivedMessageArgument::AsDoubleUnchecked(ReceivedMessageArgument *this)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)this->argumentPtr_;
  return (double)(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                  (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                  (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                 | uVar1 << 0x38);
}

Assistant:

double ReceivedMessageArgument::AsDoubleUnchecked() const
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        double d;
        char c[8];
    } u;

    u.c[0] = argumentPtr_[7];
    u.c[1] = argumentPtr_[6];
    u.c[2] = argumentPtr_[5];
    u.c[3] = argumentPtr_[4];
    u.c[4] = argumentPtr_[3];
    u.c[5] = argumentPtr_[2];
    u.c[6] = argumentPtr_[1];
    u.c[7] = argumentPtr_[0];

    return u.d;
#else
	return *(double*)argument_;
#endif
}